

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrFromUtf8(ImWchar *buf,int buf_size,char *in_text,char *in_text_end,
                     char **in_text_remaining)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  undefined2 *in_RDI;
  long *in_R8;
  bool bVar2;
  uint c;
  ImWchar *buf_end;
  ImWchar *buf_out;
  uint local_3c;
  undefined2 *local_38;
  undefined2 *local_30;
  long *local_28;
  char *local_20;
  char *local_18;
  undefined2 *local_8;
  
  local_38 = in_RDI + in_ESI;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while( true ) {
    bVar2 = false;
    if ((local_30 < local_38 + -1) &&
       ((local_20 == (char *)0x0 || (bVar2 = false, local_18 < local_20)))) {
      bVar2 = *local_18 != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(&local_3c,local_18,local_20);
    local_18 = local_18 + iVar1;
    if (local_3c == 0) break;
    *local_30 = (short)local_3c;
    local_30 = local_30 + 1;
  }
  *local_30 = 0;
  if (local_28 != (long *)0x0) {
    *local_28 = (long)local_18;
  }
  return (int)((long)local_30 - (long)local_8 >> 1);
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}